

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TableGetColumnIsVisible(int column_n)

{
  ImGuiTable *pIVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)column_n;
  pIVar1 = GImGui->CurrentTable;
  if (pIVar1 != (ImGuiTable *)0x0) {
    if (column_n < 0) {
      uVar2 = (ulong)(uint)pIVar1->CurrentColumn;
    }
    return (pIVar1->VisibleUnclippedMaskByIndex >> (uVar2 & 0x3f) & 1) != 0;
  }
  return false;
}

Assistant:

bool    ImGui::TableGetColumnIsVisible(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return false;
    if (column_n < 0)
        column_n = table->CurrentColumn;
    return (table->VisibleUnclippedMaskByIndex & ((ImU64)1 << column_n)) != 0;
}